

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

size_t helics::detail::getDataSize(byte *data)

{
  byte *data_local;
  
  return (ulong)data[4] * 0x1000000 + (ulong)data[5] * 0x10000 + (ulong)data[6] * 0x100 +
         (ulong)data[7];
}

Assistant:

size_t getDataSize(const std::byte* data)
{
    return (std::to_integer<size_t>(data[4]) << 24U) + (std::to_integer<size_t>(data[5]) << 16U) +
        (std::to_integer<size_t>(data[6]) << 8U) + std::to_integer<size_t>(data[7]);
}